

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetNumericVectorConstantWithWords
          (ConstantManager *this,Vector *type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words)

{
  Type *type_00;
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *pCVar4;
  Instruction *this_00;
  undefined4 extraout_var_01;
  uint uVar5;
  uint uVar6;
  pointer puVar7;
  ulong uVar8;
  uint32_t element_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> const_data;
  uint32_t local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  ulong local_50;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  long lVar3;
  
  type_00 = type->element_type_;
  local_70 = literal_words;
  iVar1 = (*type_00->_vptr_Type[0xc])(type_00);
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 == 0) {
    iVar1 = (*type_00->_vptr_Type[10])(type_00);
    lVar3 = CONCAT44(extraout_var_00,iVar1);
    if (lVar3 == 0) {
      iVar1 = (*type_00->_vptr_Type[8])(type_00);
      uVar6 = (uint)(CONCAT44(extraout_var_01,iVar1) != 0);
      goto LAB_005430d5;
    }
  }
  uVar6 = *(uint *)(lVar3 + 0x24) >> 5;
LAB_005430d5:
  if ((uVar6 - 3 < 0xfffffffe) ||
     (type->count_ * uVar6 !=
      (int)((ulong)((long)(local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start) >> 2))) {
    pCVar4 = (Constant *)0x0;
  }
  else {
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    if (type->count_ != 0) {
      local_50 = (ulong)uVar6;
      uVar5 = 0;
      uVar8 = 0;
      do {
        puVar7 = (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start + uVar5;
        local_48 = (void *)0x0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,puVar7,
                   puVar7 + local_50);
        pCVar4 = GetConstant(this,type_00,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
        this_00 = GetDefiningInstruction(this,pCVar4,0,(inst_iterator *)0x0);
        uVar2 = 0;
        if (this_00->has_result_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
        }
        local_74 = uVar2;
        if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_74);
        }
        else {
          *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar2;
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_48 != (void *)0x0) {
          operator_delete(local_48,local_38 - (long)local_48);
        }
        uVar8 = uVar8 + 1;
        uVar5 = uVar5 + uVar6;
      } while (uVar8 < type->count_);
    }
    pCVar4 = GetConstant(this,&type->super_Type,&local_68);
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return pCVar4;
}

Assistant:

const Constant* ConstantManager::GetNumericVectorConstantWithWords(
    const Vector* type, const std::vector<uint32_t>& literal_words) {
  const auto* element_type = type->element_type();
  uint32_t words_per_element = 0;
  if (const auto* float_type = element_type->AsFloat())
    words_per_element = float_type->width() / 32;
  else if (const auto* int_type = element_type->AsInteger())
    words_per_element = int_type->width() / 32;
  else if (element_type->AsBool() != nullptr)
    words_per_element = 1;

  if (words_per_element != 1 && words_per_element != 2) return nullptr;

  if (words_per_element * type->element_count() !=
      static_cast<uint32_t>(literal_words.size())) {
    return nullptr;
  }

  std::vector<uint32_t> element_ids;
  for (uint32_t i = 0; i < type->element_count(); ++i) {
    auto first_word = literal_words.begin() + (words_per_element * i);
    std::vector<uint32_t> const_data(first_word,
                                     first_word + words_per_element);
    const analysis::Constant* element_constant =
        GetConstant(element_type, const_data);
    auto element_id = GetDefiningInstruction(element_constant)->result_id();
    element_ids.push_back(element_id);
  }

  return GetConstant(type, element_ids);
}